

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

char * mpack_node_data_alloc(mpack_node_t node,size_t maxlen)

{
  void *__dest;
  char *pcVar1;
  mpack_tree_error_t p_Var2;
  mpack_error_t mVar3;
  mpack_tree_t *pmVar4;
  mpack_node_data_t *pmVar5;
  ulong __size;
  
  pmVar4 = node.tree;
  pmVar5 = node.data;
  if (pmVar4->error == mpack_ok) {
    if (pmVar5->type - mpack_type_array < 0xfffffffd) {
      pmVar4->error = mpack_error_type;
      p_Var2 = pmVar4->error_fn;
      if (p_Var2 == (mpack_tree_error_t)0x0) {
        return (char *)0x0;
      }
      mVar3 = mpack_error_type;
    }
    else {
      __size = (ulong)pmVar5->len;
      if (maxlen < __size) {
        pmVar4->error = mpack_error_too_big;
        p_Var2 = pmVar4->error_fn;
        if (p_Var2 == (mpack_tree_error_t)0x0) {
          return (char *)0x0;
        }
        mVar3 = mpack_error_too_big;
      }
      else {
        __dest = malloc(__size);
        if (__dest != (void *)0x0) {
          pcVar1 = (char *)memcpy(__dest,pmVar4->data + (long)(pmVar5->value).children,__size);
          return pcVar1;
        }
        pmVar4->error = mpack_error_memory;
        p_Var2 = pmVar4->error_fn;
        if (p_Var2 == (mpack_tree_error_t)0x0) {
          return (char *)0x0;
        }
        mVar3 = mpack_error_memory;
      }
    }
    (*p_Var2)(pmVar4,mVar3);
  }
  return (char *)0x0;
}

Assistant:

char* mpack_node_data_alloc(mpack_node_t node, size_t maxlen) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    // make sure this is a valid data type
    mpack_type_t type = node.data->type;
    if (type != mpack_type_str && type != mpack_type_bin && type != mpack_type_ext) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    if (node.data->len > maxlen) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return NULL;
    }

    char* ret = (char*) MPACK_MALLOC((size_t)node.data->len);
    if (ret == NULL) {
        mpack_node_flag_error(node, mpack_error_memory);
        return NULL;
    }

    mpack_memcpy(ret, mpack_node_data_unchecked(node), node.data->len);
    return ret;
}